

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::SeekHead::Finalize(SeekHead *this,IMkvWriter *writer)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint64 uVar5;
  uint64 uVar6;
  undefined4 extraout_var;
  uint64_t uVar7;
  undefined4 extraout_var_00;
  long lVar8;
  SeekHead *this_00;
  ulong uVar9;
  uint64 uVar10;
  bool bVar11;
  uint64_t entry_size [5];
  uint64 auStack_70 [8];
  
  auStack_70[2] = 0x853ded;
  iVar3 = (*writer->_vptr_IMkvWriter[3])(writer);
  if ((char)iVar3 != '\0') {
    if (this->start_pos_ == -1) {
      return false;
    }
    lVar8 = 3;
    uVar10 = 0;
    do {
      if ((ulong)this->seek_entry_id_[lVar8 + -3] != 0) {
        auStack_70[2] = 0x853e1c;
        uVar5 = EbmlElementSize(0x53ab,(ulong)this->seek_entry_id_[lVar8 + -3]);
        auStack_70[lVar8] = uVar5;
        auStack_70[2] = 0x853e32;
        uVar6 = EbmlElementSize(0x53ac,*(uint64 *)(this->seek_entry_id_ + lVar8 * 2));
        uVar6 = uVar6 + uVar5;
        auStack_70[lVar8] = uVar6;
        auStack_70[2] = 0x853e4a;
        uVar5 = EbmlMasterElementSize(0x4dbb,uVar6);
        uVar10 = uVar6 + uVar10 + uVar5;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    bVar11 = uVar10 == 0;
    if (bVar11) {
      return bVar11;
    }
    auStack_70[2] = 0x853e72;
    iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
    auStack_70[2] = 0x853e82;
    iVar4 = (*writer->_vptr_IMkvWriter[2])(writer,this->start_pos_);
    if (iVar4 != 0) {
      return bVar11;
    }
    auStack_70[2] = 0x853e9a;
    this_00 = (SeekHead *)writer;
    bVar1 = WriteEbmlMasterElement(writer,0x114d9b74,uVar10);
    if (!bVar1) {
      return bVar11;
    }
    uVar9 = 0;
    bVar1 = false;
    do {
      if (this->seek_entry_id_[uVar9] != 0) {
        auStack_70[2] = 0x853ec0;
        this_00 = (SeekHead *)writer;
        bVar2 = WriteEbmlMasterElement(writer,0x4dbb,auStack_70[uVar9 + 3]);
        if (bVar2) {
          auStack_70[2] = 0x853ed5;
          this_00 = (SeekHead *)writer;
          bVar2 = WriteEbmlElement(writer,0x53ab,(ulong)this->seek_entry_id_[uVar9]);
          if (bVar2) {
            auStack_70[2] = 0x853eeb;
            this_00 = (SeekHead *)writer;
            bVar2 = WriteEbmlElement(writer,0x53ac,this->seek_entry_pos_[uVar9]);
            if (bVar2) goto LAB_00853eef;
          }
        }
        if (!bVar1) {
          return bVar11;
        }
        break;
      }
LAB_00853eef:
      bVar1 = 3 < uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar9 != 5);
    auStack_70[2] = 0x853f16;
    uVar7 = MaxEntrySize(this_00);
    auStack_70[2] = 0x853f27;
    uVar10 = EbmlMasterElementSize(0x114d9b74,uVar7 * 5);
    auStack_70[2] = 0x853f33;
    iVar4 = (*writer->_vptr_IMkvWriter[1])(writer);
    auStack_70[2] = 0x853f48;
    uVar10 = WriteVoidElement(writer,((uVar10 + uVar7 * 5) - CONCAT44(extraout_var_00,iVar4)) +
                                     this->start_pos_);
    if (uVar10 == 0) {
      return bVar11;
    }
    auStack_70[2] = 0x853f59;
    iVar3 = (*writer->_vptr_IMkvWriter[2])(writer,CONCAT44(extraout_var,iVar3));
    if (iVar3 != 0) {
      return bVar11;
    }
  }
  return true;
}

Assistant:

bool SeekHead::Finalize(IMkvWriter* writer) const {
  if (writer->Seekable()) {
    if (start_pos_ == -1)
      return false;

    uint64_t payload_size = 0;
    uint64_t entry_size[kSeekEntryCount];

    for (int32_t i = 0; i < kSeekEntryCount; ++i) {
      if (seek_entry_id_[i] != 0) {
        entry_size[i] = EbmlElementSize(libwebm::kMkvSeekID,
                                        static_cast<uint64>(seek_entry_id_[i]));
        entry_size[i] += EbmlElementSize(
            libwebm::kMkvSeekPosition, static_cast<uint64>(seek_entry_pos_[i]));

        payload_size +=
            EbmlMasterElementSize(libwebm::kMkvSeek, entry_size[i]) +
            entry_size[i];
      }
    }

    // No SeekHead elements
    if (payload_size == 0)
      return true;

    const int64_t pos = writer->Position();
    if (writer->Position(start_pos_))
      return false;

    if (!WriteEbmlMasterElement(writer, libwebm::kMkvSeekHead, payload_size))
      return false;

    for (int32_t i = 0; i < kSeekEntryCount; ++i) {
      if (seek_entry_id_[i] != 0) {
        if (!WriteEbmlMasterElement(writer, libwebm::kMkvSeek, entry_size[i]))
          return false;

        if (!WriteEbmlElement(writer, libwebm::kMkvSeekID,
                              static_cast<uint64>(seek_entry_id_[i])))
          return false;

        if (!WriteEbmlElement(writer, libwebm::kMkvSeekPosition,
                              static_cast<uint64>(seek_entry_pos_[i])))
          return false;
      }
    }

    const uint64_t total_entry_size = kSeekEntryCount * MaxEntrySize();
    const uint64_t total_size =
        EbmlMasterElementSize(libwebm::kMkvSeekHead, total_entry_size) +
        total_entry_size;
    const int64_t size_left = total_size - (writer->Position() - start_pos_);

    const uint64_t bytes_written = WriteVoidElement(writer, size_left);
    if (!bytes_written)
      return false;

    if (writer->Position(pos))
      return false;
  }

  return true;
}